

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

char * __thiscall leveldb::Arena::Allocate(Arena *this,size_t bytes)

{
  char *pcVar1;
  ulong in_RSI;
  long *in_RDI;
  char *result;
  Arena *in_stack_fffffffffffffff8;
  
  if ((ulong)in_RDI[1] < in_RSI) {
    pcVar1 = AllocateFallback(in_stack_fffffffffffffff8,(size_t)in_RDI);
  }
  else {
    pcVar1 = (char *)*in_RDI;
    *in_RDI = in_RSI + *in_RDI;
    in_RDI[1] = in_RDI[1] - in_RSI;
  }
  return pcVar1;
}

Assistant:

inline char* Arena::Allocate(size_t bytes) {
  // The semantics of what to return are a bit messy if we allow
  // 0-byte allocations, so we disallow them here (we don't need
  // them for our internal use).
  assert(bytes > 0);
  if (bytes <= alloc_bytes_remaining_) {
    char* result = alloc_ptr_;
    alloc_ptr_ += bytes;
    alloc_bytes_remaining_ -= bytes;
    return result;
  }
  return AllocateFallback(bytes);
}